

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O3

void __thiscall wasm::SafeHeap::addLoadFunc(SafeHeap *this,Load style,Module *module)

{
  MixedArena *this_00;
  Module *pMVar1;
  Type addressType;
  Name name;
  Function *pFVar2;
  Memory *pMVar3;
  Block *this_01;
  Expression *pEVar4;
  Expression *pEVar5;
  Binary *this_02;
  LocalSet *item;
  undefined1 *puVar6;
  BinaryOp BVar7;
  ExpressionList *this_03;
  Name name_00;
  initializer_list<wasm::Type> types;
  Signature sig;
  initializer_list<wasm::Type> __l;
  optional<wasm::Type> type_;
  Name name_01;
  Type local_98;
  Type local_90;
  HeapType local_88;
  SafeHeap *local_80;
  Type local_78;
  Builder builder;
  pointer local_68;
  _Head_base<0UL,_wasm::Function_*,_false> local_40;
  allocator_type local_31;
  
  name_00 = getLoadName(&style);
  pFVar2 = Module::getFunctionOrNull(module,name_00);
  if (pFVar2 == (Function *)0x0) {
    name.super_IString.str._M_str = style.memory.super_IString.str._M_str;
    name.super_IString.str._M_len = style.memory.super_IString.str._M_len;
    local_80 = this;
    pMVar3 = Module::getMemory(module,name);
    pMVar1 = (Module *)(pMVar3->addressType).id;
    types._M_len = 2;
    types._M_array = &stack0xffffffffffffff88;
    local_78.id = (uintptr_t)pMVar1;
    builder.wasm = pMVar1;
    wasm::Type::Type(&local_98,types);
    sig.results.id =
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id;
    sig.params.id = local_98.id;
    HeapType::HeapType(&local_88,sig);
    __l._M_len = 1;
    __l._M_array = &local_90;
    local_90.id = (uintptr_t)pMVar1;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff88,__l,
               &local_31);
    name_01.super_IString.str._M_str = name_00.super_IString.str._M_len;
    name_01.super_IString.str._M_len = (size_t)&local_40;
    Builder::makeFunction
              (name_01,(HeapType)name_00.super_IString.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_88.id,
               (Expression *)&stack0xffffffffffffff88);
    if ((Module *)local_78.id != (Module *)0x0) {
      operator_delete((void *)local_78.id,(long)local_68 - local_78.id);
    }
    this_00 = &module->allocator;
    local_78.id = (uintptr_t)module;
    this_01 = (Block *)MixedArena::allocSpace(this_00,0x40,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    (this_01->name).super_IString.str._M_len = 0;
    (this_01->name).super_IString.str._M_str = (char *)0x0;
    (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
         = (Expression **)0x0;
    (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements = 0;
    (this_01->list).allocator = this_00;
    BVar7 = AddInt64;
    if ((pMVar3->addressType).id != 3) {
      BVar7 = AddInt32;
    }
    pEVar4 = (Expression *)MixedArena::allocSpace(this_00,0x18,8);
    pEVar4->_id = LocalGetId;
    *(undefined4 *)(pEVar4 + 1) = 0;
    (pEVar4->type).id = (uintptr_t)pMVar1;
    pEVar5 = (Expression *)MixedArena::allocSpace(this_00,0x18,8);
    pEVar5->_id = LocalGetId;
    *(undefined4 *)(pEVar5 + 1) = 1;
    (pEVar5->type).id = (uintptr_t)pMVar1;
    this_02 = (Binary *)MixedArena::allocSpace(this_00,0x28,8);
    (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_02->op = BVar7;
    this_02->left = pEVar4;
    this_02->right = pEVar5;
    Binary::finalize(this_02);
    item = Builder::makeLocalSet((Builder *)&stack0xffffffffffffff88,2,(Expression *)this_02);
    this_03 = &this_01->list;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_03->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
    addressType.id = (pMVar3->addressType).id;
    pEVar4 = makeBoundsCheck(local_80,style.super_SpecificExpression<(wasm::Expression::Id)12>.
                                      super_Expression.type,(Builder *)&stack0xffffffffffffff88,0,2,
                             (uint)style.bytes,module,addressType,addressType.id == 3,
                             (Name)(pMVar3->super_Importable).super_Named.name.super_IString.str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_03->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar4);
    if (1 < style.align.addr) {
      pEVar4 = makeAlignCheck(local_80,style.align,(Builder *)&stack0xffffffffffffff88,2,module,
                              (Name)(pMVar3->super_Importable).super_Named.name.super_IString.str);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_03->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar4)
      ;
    }
    pEVar5 = (Expression *)MixedArena::allocSpace(this_00,0x48,8);
    pEVar5->_id = LoadId;
    (pEVar5->type).id = 0;
    pEVar5[1].field_0x1 = 0;
    pEVar5[3].type.id = 0;
    *(undefined8 *)(pEVar5 + 4) = 0;
    pEVar5[1].type.id = 0;
    *(undefined8 *)(pEVar5 + 2) = 0;
    pEVar5->_id = style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression._id;
    *(undefined7 *)&pEVar5->field_0x1 =
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression._1_7_;
    (pEVar5->type).id =
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id;
    *(ushort *)(pEVar5 + 1) = CONCAT11(style.signed_,style.bytes);
    pEVar5[1].type.id = style.offset.addr;
    *(address64_t *)(pEVar5 + 2) = style.align.addr;
    pEVar5[2].type.id = style._40_8_;
    *(Expression **)(pEVar5 + 3) = style.ptr;
    pEVar5[3].type.id = style.memory.super_IString.str._M_len;
    *(char **)(pEVar5 + 4) = style.memory.super_IString.str._M_str;
    puVar6 = (undefined1 *)MixedArena::allocSpace((MixedArena *)(local_78.id + 0x200),0x18,8);
    *puVar6 = 8;
    *(undefined4 *)(puVar6 + 0x10) = 2;
    *(Module **)(puVar6 + 8) = pMVar1;
    *(undefined1 **)(pEVar5 + 3) = puVar6;
    pEVar4 = pEVar5;
    if (((char)pEVar5[2].type.id == '\x01') && (pEVar5[1].field_0x1 == '\x01')) {
      pEVar4 = Bits::makeSignExt(pEVar5,(uint)pEVar5[1]._id,module);
      pEVar5[1].field_0x1 = 0;
    }
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_03->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar4);
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload._M_value.id =
         (Type)(Type)style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.
                     id;
    Block::finalize(this_01,type_,Unknown);
    (local_40._M_head_impl)->body = (Expression *)this_01;
    Module::addFunction(module,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                               &local_40);
    if (local_40._M_head_impl != (Function *)0x0) {
      std::default_delete<wasm::Function>::operator()
                ((default_delete<wasm::Function> *)&local_40,local_40._M_head_impl);
    }
  }
  return;
}

Assistant:

void addLoadFunc(Load style, Module* module) {
    auto name = getLoadName(&style);
    if (module->getFunctionOrNull(name)) {
      return;
    }
    // pointer, offset
    auto memory = module->getMemory(style.memory);
    auto addressType = memory->addressType;
    auto funcSig = Signature({addressType, addressType}, style.type);
    auto func = Builder::makeFunction(name, funcSig, {addressType});
    Builder builder(*module);
    auto* block = builder.makeBlock();
    // stash the sum of the pointer (0) and the size (1) in a local (2)
    block->list.push_back(builder.makeLocalSet(
      2,
      builder.makeBinary(memory->is64() ? AddInt64 : AddInt32,
                         builder.makeLocalGet(0, addressType),
                         builder.makeLocalGet(1, addressType))));
    // check for reading past valid memory: if pointer + offset + bytes
    block->list.push_back(makeBoundsCheck(style.type,
                                          builder,
                                          0,
                                          2,
                                          style.bytes,
                                          module,
                                          memory->addressType,
                                          memory->is64(),
                                          memory->name));
    // check proper alignment
    if (style.align > 1) {
      block->list.push_back(
        makeAlignCheck(style.align, builder, 2, module, memory->name));
    }
    // do the load
    auto* load = module->allocator.alloc<Load>();
    *load = style; // basically the same as the template we are given!
    load->ptr = builder.makeLocalGet(2, addressType);
    Expression* last = load;
    if (load->isAtomic && load->signed_) {
      // atomic loads cannot be signed, manually sign it
      last = Bits::makeSignExt(load, load->bytes, *module);
      load->signed_ = false;
    }
    block->list.push_back(last);
    block->finalize(style.type);
    func->body = block;
    module->addFunction(std::move(func));
  }